

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O1

void copy_objects_internal(Am_Object *cmd,Am_Value *new_sel)

{
  unsigned_short uVar1;
  Am_Wrapper *pAVar2;
  Am_Object group;
  Am_Object selection_widget;
  Am_Value_List selected_objs;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Value_List local_40;
  Am_Value_List local_30;
  Am_Value local_20;
  
  local_68.data = (Am_Object_Data *)0x0;
  local_70.data = (Am_Object_Data *)0x0;
  Am_Value_List::Am_Value_List(&local_40);
  Am_Object::Am_Object(&local_50,cmd);
  Am_Get_Selection_Widget_For_Command(&local_48);
  Am_Object::operator=(&local_68,&local_48);
  Am_Object::~Am_Object(&local_48);
  Am_Object::~Am_Object(&local_50);
  Am_Object::Am_Object(&local_58,&local_68);
  Am_Value::Am_Value(&local_20,new_sel);
  Am_Get_Sel_Or_Param_In_Display_Order(&local_58,&local_40,&local_70,&local_20);
  Am_Value::~Am_Value(&local_20);
  Am_Object::~Am_Object(&local_58);
  pAVar2 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_40);
  Am_Object::Set(cmd,0x16d,pAVar2,0);
  Am_Object::Set(cmd,0x16f,false,0);
  pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(&local_70);
  Am_Object::Set(cmd,0x171,pAVar2,0);
  Am_Object::Am_Object(&local_60,cmd);
  Am_Value_List::Am_Value_List(&local_30,&local_40);
  copy_objects_into_clipboard(&local_60,&local_30);
  Am_Value_List::~Am_Value_List(&local_30);
  Am_Object::~Am_Object(&local_60);
  uVar1 = Am_Value_List::Length(&local_40);
  Am_Object::Set(cmd,0x169,(uint)uVar1,0);
  Am_Value_List::~Am_Value_List(&local_40);
  Am_Object::~Am_Object(&local_70);
  Am_Object::~Am_Object(&local_68);
  return;
}

Assistant:

void
copy_objects_internal(Am_Object &cmd, Am_Value new_sel)
{
  Am_Object selection_widget, group;
  Am_Value_List selected_objs;
  selection_widget = Am_Get_Selection_Widget_For_Command(cmd);
  Am_Get_Sel_Or_Param_In_Display_Order(selection_widget, selected_objs, group,
                                       new_sel);
  cmd.Set(Am_OBJECT_MODIFIED, selected_objs);
  cmd.Set(Am_HAS_BEEN_UNDONE, false);
  cmd.Set(Am_SAVED_OLD_OBJECT_OWNER, group);
  copy_objects_into_clipboard(cmd, selected_objs);
  cmd.Set(Am_VALUE, selected_objs.Length()); //not used
}